

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O1

int decompressBlock(roslz4_stream *str)

{
  void *pvVar1;
  XXH_errorcode XVar2;
  uint uVar3;
  int iVar4;
  
  pvVar1 = str->state;
  iVar4 = -1;
  if (*(int *)((long)pvVar1 + 0x44) == 4) {
    uVar3 = *(uint *)((long)pvVar1 + 0x40);
    if (uVar3 == *(uint *)((long)pvVar1 + 0x1c)) {
      if (*(int *)((long)pvVar1 + 0x48) == 0) {
        uVar3 = LZ4_decompress_safe(*(char **)((long)pvVar1 + 0x10),str->output_next,uVar3,
                                    str->output_left);
        if ((int)uVar3 < 0) {
          return (str->output_left < *(int *)((long)pvVar1 + 0x18)) - 3;
        }
        XVar2 = XXH32_update(*(void **)((long)pvVar1 + 0x28),str->output_next,uVar3);
        if (XVar2 == XXH_ERROR) {
          return -1;
        }
        str->output_next = str->output_next + uVar3;
        str->output_left = str->output_left - uVar3;
        str->total_out = str->total_out + uVar3;
      }
      else {
        if ((uint)str->output_left < uVar3) {
          return -2;
        }
        memcpy(str->output_next,*(void **)((long)pvVar1 + 0x10),(ulong)uVar3);
        XVar2 = XXH32_update(*(void **)((long)pvVar1 + 0x28),str->output_next,
                             *(int *)((long)pvVar1 + 0x40));
        if (XVar2 == XXH_ERROR) {
          return -1;
        }
        iVar4 = *(int *)((long)pvVar1 + 0x40);
        str->output_next = str->output_next + iVar4;
        str->output_left = str->output_left - iVar4;
        str->total_out = str->total_out + iVar4;
      }
      iVar4 = 0;
      *(undefined4 *)((long)pvVar1 + 0x44) = 0;
      *(undefined4 *)((long)pvVar1 + 0x1c) = 0;
    }
  }
  return iVar4;
}

Assistant:

int decompressBlock(roslz4_stream *str) {
  stream_state *state = str->state;
  if (state->block_size_read != 4 || state->block_size != state->buffer_offset) {
    // Internal error: Can't decompress block, it's not in buffer
    return ROSLZ4_ERROR;
  }

  if (state->block_uncompressed) {
    if (str->output_left >= state->block_size) {
      memcpy(str->output_next, state->buffer, state->block_size);
      int ret = XXH32_update(state->xxh32_state, str->output_next,
                             state->block_size);
      if (ret == XXH_ERROR) { return ROSLZ4_ERROR; }
      advanceOutput(str, state->block_size);
      state->block_size_read = 0;
      state->buffer_offset = 0;
      return ROSLZ4_OK;
    } else {
      return ROSLZ4_OUTPUT_SMALL;
    }
  } else {
    int decomp_size;
    decomp_size = LZ4_decompress_safe(state->buffer, str->output_next,
                                      state->block_size, str->output_left);
    if (decomp_size < 0) {
      if (str->output_left >= state->buffer_size) {
        return ROSLZ4_DATA_ERROR; // Must be a problem with the data stream
      } else {
        // Data error or output is small; increase output to disambiguate
        return ROSLZ4_OUTPUT_SMALL;
      }
    } else {
      int ret = XXH32_update(state->xxh32_state, str->output_next, decomp_size);
      if (ret == XXH_ERROR) { return ROSLZ4_ERROR; }
      advanceOutput(str, decomp_size);
      state->block_size_read = 0;
      state->buffer_offset = 0;
      return ROSLZ4_OK;
    }
  }
}